

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O2

size_t __thiscall
kj::_::BTreeImpl::verifyNode
          (BTreeImpl *this,size_t size,FunctionParam<bool_(unsigned_int,_unsigned_int)> *f,uint pos,
          uint height,MaybeUint maxRow)

{
  MaybeUint maxRow_00;
  FunctionParam<bool_(unsigned_int,_unsigned_int)> *pFVar1;
  uint uVar2;
  size_t sVar3;
  uint uVar4;
  uint uVar5;
  Leaf *this_00;
  long lVar6;
  uint n;
  uint i;
  Fault f_1;
  MaybeUint maxRow_local;
  size_t size_local;
  FunctionParam<bool_(unsigned_int,_unsigned_int)> *local_70;
  DebugComparison<unsigned_int,_unsigned_long_&> _kjCondition;
  
  this_00 = (Leaf *)(this->tree + pos);
  maxRow_local = maxRow;
  size_local = size;
  local_70 = f;
  if (height == 0) {
    uVar2 = Leaf::size(this_00);
    n = uVar2;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      uVar4 = this_00->rows[uVar5].i - 1;
      _kjCondition.left = uVar4;
      _kjCondition.op.content.ptr = " < ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = uVar4 < size_local;
      i = uVar5;
      _kjCondition.right = &size_local;
      if (size_local <= uVar4) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long&>&,unsigned_int&,unsigned_int&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0xc2,FAILED,"*leaf.rows[i] < size","_kjCondition,n, i",&_kjCondition,&n,&i);
        Debug::Fault::fatal(&f_1);
      }
      if (uVar5 != 0) {
        f_1.exception._0_1_ =
             (*(code *)**(undefined8 **)local_70->space)(local_70,this_00->rows[uVar5 - 1].i - 1);
        if ((char)f_1.exception == '\0') {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0xc5,FAILED,"f(*leaf.rows[i - 1], *leaf.rows[i])",
                     "_kjCondition,n, i, leaf.rows[i - 1], leaf.rows[i]",
                     (DebugExpression<bool> *)&f_1,&n,&i,this_00->rows + (i - 1),this_00->rows + i);
          Debug::Fault::fatal((Fault *)&_kjCondition);
        }
      }
    }
    sVar3 = (size_t)n;
    if (maxRow_local.i != 0) {
      _kjCondition._0_8_ = this_00->rows + (n - 1);
      _kjCondition.result = ((MaybeUint *)_kjCondition._0_8_)->i == maxRow_local.i;
      _kjCondition.right = (unsigned_long *)&maxRow_local;
      _kjCondition.op.content.ptr = " == ";
      _kjCondition.op.content.size_ = 5;
      if (!_kjCondition.result) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>&,unsigned_int&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0xc9,FAILED,"leaf.rows[n-1] == maxRow","_kjCondition,n",
                   (DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_kj::_::BTreeImpl::MaybeUint_&> *)
                   &_kjCondition,&n);
        Debug::Fault::fatal(&f_1);
      }
    }
  }
  else {
    uVar2 = Parent::keyCount((Parent *)this_00);
    lVar6 = 0;
    n = uVar2;
    for (uVar5 = 0; pFVar1 = local_70, uVar2 != uVar5; uVar5 = uVar5 + 1) {
      maxRow_00.i = this_00->rows[(ulong)uVar5 - 1].i;
      uVar4 = maxRow_00.i - 1;
      _kjCondition.left = uVar4;
      _kjCondition.right = &size_local;
      _kjCondition.op.content.ptr = " < ";
      _kjCondition.op.content.size_ = 4;
      _kjCondition.result = uVar4 < size_local;
      i = uVar5;
      if (size_local <= uVar4) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_long&>&,unsigned_int&,unsigned_int&>
                  (&f_1,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0xb2,FAILED,"*parent.keys[i] < size","_kjCondition,n, i",&_kjCondition,&n,&i);
        Debug::Fault::fatal(&f_1);
      }
      sVar3 = verifyNode(this,size_local,local_70,this_00->rows[(ulong)uVar5 + 6].i,height - 1,
                         maxRow_00);
      if ((ulong)i != 0) {
        f_1.exception._0_1_ =
             (*(code *)**(undefined8 **)local_70->space)
                       (local_70,this_00->rows[(ulong)(i - 1) - 1].i - 1,
                        this_00->rows[(ulong)i - 1].i - 1);
        if ((char)f_1.exception == '\0') {
          Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
                    ((Fault *)&_kjCondition,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                     ,0xb6,FAILED,"f(*parent.keys[i - 1], *parent.keys[i])",
                     "_kjCondition,n, i, parent.keys[i - 1], parent.keys[i]",
                     (DebugExpression<bool> *)&f_1,&n,&i,this_00->rows + ((ulong)(i - 1) - 1),
                     this_00->rows + ((ulong)i - 1));
          Debug::Fault::fatal((Fault *)&_kjCondition);
        }
      }
      lVar6 = lVar6 + sVar3;
    }
    sVar3 = verifyNode(this,size_local,local_70,this_00->rows[(ulong)n + 6].i,height - 1,
                       maxRow_local);
    if (maxRow_local.i != 0) {
      f_1.exception._0_1_ =
           (*(code *)**(undefined8 **)pFVar1->space)
                     (pFVar1,this_00->rows[(ulong)(n - 1) - 1].i - 1,maxRow_local.i - 1);
      if ((char)f_1.exception == '\0') {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,unsigned_int&,kj::_::BTreeImpl::MaybeUint&,kj::_::BTreeImpl::MaybeUint&>
                  ((Fault *)&_kjCondition,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0xbb,FAILED,"f(*parent.keys[n-1], *maxRow)",
                   "_kjCondition,n, parent.keys[n-1], maxRow",(DebugExpression<bool> *)&f_1,&n,
                   this_00->rows + ((ulong)(n - 1) - 1),&maxRow_local);
        Debug::Fault::fatal((Fault *)&_kjCondition);
      }
    }
    sVar3 = sVar3 + lVar6;
  }
  return sVar3;
}

Assistant:

size_t BTreeImpl::verifyNode(size_t size, FunctionParam<bool(uint, uint)>& f,
                             uint pos, uint height, MaybeUint maxRow) {
  if (height > 0) {
    auto& parent = tree[pos].parent;

    auto n = parent.keyCount();
    size_t total = 0;
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*parent.keys[i] < size, n, i);
      total += verifyNode(size, f, parent.children[i], height - 1, parent.keys[i]);
      if (i > 0) {
        KJ_ASSERT(f(*parent.keys[i - 1], *parent.keys[i]),
            n, i, parent.keys[i - 1], parent.keys[i]);
      }
    }
    total += verifyNode(size, f, parent.children[n], height - 1, maxRow);
    if (maxRow != nullptr) {
      KJ_ASSERT(f(*parent.keys[n-1], *maxRow), n, parent.keys[n-1], maxRow);
    }
    return total;
  } else {
    auto& leaf = tree[pos].leaf;
    auto n = leaf.size();
    for (auto i: kj::zeroTo(n)) {
      KJ_ASSERT(*leaf.rows[i] < size, n, i);
      if (i > 0) {
        KJ_ASSERT(f(*leaf.rows[i - 1], *leaf.rows[i]),
            n, i, leaf.rows[i - 1], leaf.rows[i]);
      }
    }
    if (maxRow != nullptr) {
      KJ_ASSERT(leaf.rows[n-1] == maxRow, n);
    }
    return n;
  }
}